

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O1

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::applyFunction
          (Evaluator *this,GCPtr<symbols::Object> *obj,
          vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args)

{
  FunctionObject *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Env *env;
  Object *t_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar3;
  GCPtr<symbols::FunctionObject> function;
  GCPtr<symbols::Object> evaluated;
  string strValue;
  GCPtr<symbols::FunctionObject> local_a8;
  GCPtr<symbols::Object> local_a0;
  size_type local_98;
  Object local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*obj->addr->_vptr_Object[3])(&local_40);
  plVar3 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
  do {
    plVar3 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
             (plVar3->
             super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (plVar3 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
  } while (((_List_node_base *)((long)plVar3 + 0x10))->_M_prev != (_List_node_base *)obj->addr);
  std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::remove
            (&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar3 + 0x10));
  if (((_List_node_base *)((long)plVar3 + 0x10))->_M_prev == (_List_node_base *)0x0) {
    t = (FunctionObject *)0x0;
  }
  else {
    t = (FunctionObject *)
        __dynamic_cast(((_List_node_base *)((long)plVar3 + 0x10))->_M_prev,
                       &symbols::Object::typeinfo,&symbols::FunctionObject::typeinfo,0);
  }
  GCPtr<symbols::FunctionObject>::GCPtr(&local_a8,t);
  if (local_a8.addr == (FunctionObject *)0x0) {
    std::operator+(&local_60,"\'",&local_40);
    pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_60,"\'");
    local_80._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
    paVar2 = &pbVar1->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar2) {
      local_80.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    }
    local_80._M_string_length = pbVar1->_M_string_length;
    (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
    pbVar1->_M_string_length = 0;
    (pbVar1->field_2)._M_local_buf[0] = '\0';
    pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_80," object not a callable");
    local_a0.addr = (Object *)(pbVar1->_M_dataplus)._M_p;
    paVar2 = &pbVar1->field_2;
    if (local_a0.addr == (Object *)paVar2) {
      local_90._vptr_Object = (_func_int **)paVar2->_M_allocated_capacity;
      local_90._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
      local_a0.addr = &local_90;
    }
    else {
      local_90._vptr_Object = (_func_int **)paVar2->_M_allocated_capacity;
    }
    local_98 = pbVar1->_M_string_length;
    (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
    pbVar1->_M_string_length = 0;
    (pbVar1->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_a0.addr != &local_90) {
      operator_delete(local_a0.addr,(long)local_90._vptr_Object + 1);
    }
  }
  env = extendFunctionEnv(&local_a8,args);
  evalBlockStatement((Evaluator *)&local_a0,(local_a8.addr)->body,env);
  t_00 = unWrapReturnvalue(&local_a0);
  GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,t_00);
  GCPtr<symbols::Object>::~GCPtr(&local_a0);
  GCPtr<symbols::FunctionObject>::~GCPtr(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::applyFunction(GCPtr<Object>& obj, std::vector<GCPtr<Object>>& args){
       auto strValue = obj->toString();
       GCPtr<FunctionObject> function = dynamic_cast<FunctionObject*>(obj.unref());
       if( function == nullptr){
           auto message = "'"+ strValue + "'" + " object not a callable";

       }
       auto env = extendFunctionEnv(function, args);
       auto evaluated = evalBlockStatement(function->body, env);
       return unWrapReturnvalue(evaluated);
}